

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::IsinfCase::compare(IsinfCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  undefined4 in_EAX;
  int iVar3;
  ostream *poVar4;
  ostringstream *poVar5;
  long lVar6;
  bool bVar7;
  undefined8 uStack_28;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uStack_28._0_4_ = in_EAX;
  iVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    if (0 < iVar3) {
      lVar6 = 0;
      do {
        bVar7 = (*(uint *)((long)*inputs + lVar6 * 4) & 0x7fffffff) == 0x7f800000;
        if (*(uint *)((long)*outputs + lVar6 * 4) != (uint)bVar7) {
          poVar5 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar5->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar4 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
          uStack_28 = (ulong)CONCAT14(bVar7,(undefined4)uStack_28);
          Functional::operator<<(poVar4,(HexBool *)((long)&uStack_28 + 4));
          return false;
        }
        lVar6 = lVar6 + 1;
      } while (iVar3 != (int)lVar6);
    }
  }
  else if (0 < iVar3) {
    lVar6 = 0;
    do {
      if (1 < *(uint *)((long)*outputs + lVar6 * 4)) {
        poVar5 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar5->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = 0 / 1",9);
        return false;
      }
      lVar6 = lVar6 + 1;
    } while (iVar3 != (int)lVar6);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
				const deUint32	ref		= tcu::Float32(in0).isInf() ? 1u : 0u;

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else
		{
			// Value can be either 0 or 1
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int out0 = ((const int*)outputs[0])[compNdx];

				if (out0 != 0 && out0 != 1)
				{
					m_failMsg << "Expected [" << compNdx << "] = 0 / 1";
					return false;
				}
			}
		}

		return true;
	}